

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O2

CoverCrossSymbol *
slang::ast::CoverCrossSymbol::fromSyntax
          (Scope *scope,CoverCrossSyntax *syntax,
          SmallVectorBase<const_slang::ast::Symbol_*> *implicitMembers)

{
  size_t sVar1;
  Compilation *args;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  int iVar2;
  IdentifierNameSyntax *syntax_01;
  CoverpointSymbol *pCVar3;
  undefined4 extraout_var;
  CoverCrossSymbol *this;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *src;
  Token *this_00;
  string_view name;
  const_iterator __begin2;
  SmallVector<const_slang::ast::CoverpointSymbol_*,_5UL> targets;
  CoverpointSymbol *local_b0;
  span<const_slang::ast::CoverpointSymbol_*,_18446744073709551615UL> local_a8;
  string_view local_98;
  CoverCrossSyntax *local_88;
  SmallVectorBase<const_slang::ast::Symbol_*> *local_80;
  SourceLocation local_78;
  SmallVectorBase<const_slang::ast::CoverpointSymbol_*> local_70 [2];
  
  local_98 = (string_view)ZEXT816(0);
  local_80 = implicitMembers;
  if (syntax->label == (NamedLabelSyntax *)0x0) {
    this_00 = &syntax->cross;
  }
  else {
    local_98 = parsing::Token::valueText(&syntax->label->name);
    this_00 = &syntax->label->name;
  }
  local_78 = parsing::Token::location(this_00);
  local_70[0].data_ = (pointer)local_70[0].firstElement;
  local_70[0].len = 0;
  local_a8._M_extent._M_extent_value = 0;
  local_70[0].cap = 5;
  sVar1 = (syntax->items).elements._M_extent._M_extent_value;
  src = extraout_RDX;
  local_a8._M_ptr = (pointer)&syntax->items;
  local_88 = syntax;
  for (; ((SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *)local_a8._M_ptr !=
          &syntax->items || (local_a8._M_extent._M_extent_value != sVar1 + 1 >> 1));
      local_a8._M_extent._M_extent_value = local_a8._M_extent._M_extent_value + 1) {
    syntax_01 = slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::
                iterator_base<const_slang::syntax::IdentifierNameSyntax_*>::dereference
                          ((iterator_base<const_slang::syntax::IdentifierNameSyntax_*> *)&local_a8);
    name = parsing::Token::valueText(&syntax_01->identifier);
    pCVar3 = (CoverpointSymbol *)Scope::find(scope,name);
    if ((pCVar3 == (CoverpointSymbol *)0x0) || ((pCVar3->super_Symbol).kind != Coverpoint)) {
      pCVar3 = CoverpointSymbol::fromImplicit(scope,syntax_01);
      local_b0 = pCVar3;
      SmallVectorBase<slang::ast::CoverpointSymbol_const*>::
      emplace_back<slang::ast::CoverpointSymbol_const*>
                ((SmallVectorBase<slang::ast::CoverpointSymbol_const*> *)local_70,&local_b0);
      local_b0 = pCVar3;
      SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*>
                ((SmallVectorBase<slang::ast::Symbol_const*> *)local_80,(Symbol **)&local_b0);
      src = extraout_RDX_01;
    }
    else {
      local_b0 = pCVar3;
      SmallVectorBase<slang::ast::CoverpointSymbol_const*>::
      emplace_back<slang::ast::CoverpointSymbol_const*>
                ((SmallVectorBase<slang::ast::CoverpointSymbol_const*> *)local_70,&local_b0);
      src = extraout_RDX_00;
    }
  }
  args = scope->compilation;
  iVar2 = SmallVectorBase<const_slang::ast::CoverpointSymbol_*>::copy
                    (local_70,(EVP_PKEY_CTX *)args,src);
  local_a8._M_ptr = (pointer)CONCAT44(extraout_var,iVar2);
  this = BumpAllocator::
         emplace<slang::ast::CoverCrossSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,std::span<slang::ast::CoverpointSymbol_const*,18446744073709551615ul>>
                   (&args->super_BumpAllocator,args,&local_98,&local_78,&local_a8);
  (this->super_Symbol).originatingSyntax = (SyntaxNode *)local_88;
  syntax_00._M_ptr =
       (local_88->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  syntax_00._M_extent._M_extent_value =
       (local_88->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
       _M_extent_value;
  Symbol::setAttributes(&this->super_Symbol,scope,syntax_00);
  SmallVectorBase<const_slang::ast::CoverpointSymbol_*>::cleanup(local_70,(EVP_PKEY_CTX *)scope);
  return this;
}

Assistant:

CoverCrossSymbol& CoverCrossSymbol::fromSyntax(const Scope& scope, const CoverCrossSyntax& syntax,
                                               SmallVectorBase<const Symbol*>& implicitMembers) {
    std::string_view name;
    SourceLocation loc;
    if (syntax.label) {
        name = syntax.label->name.valueText();
        loc = syntax.label->name.location();
    }
    else {
        loc = syntax.cross.location();
    }

    SmallVector<const CoverpointSymbol*> targets;
    for (auto item : syntax.items) {
        auto symbol = scope.find(item->identifier.valueText());
        if (symbol && symbol->kind == SymbolKind::Coverpoint) {
            targets.push_back(&symbol->as<CoverpointSymbol>());
        }
        else {
            // If we didn't find a coverpoint, create one implicitly
            // that will be initialized with this expression.
            auto& newPoint = CoverpointSymbol::fromImplicit(scope, *item);
            targets.push_back(&newPoint);
            implicitMembers.push_back(&newPoint);
        }
    }

    auto& comp = scope.getCompilation();
    auto result = comp.emplace<CoverCrossSymbol>(comp, name, loc, targets.copy(comp));
    result->setSyntax(syntax);
    result->setAttributes(scope, syntax.attributes);
    return *result;
}